

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToCharAndBackupInst::Exec
          (SyncToCharAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  uint *puVar2;
  bool bVar3;
  CharCountOrFlag local_4c;
  uint local_48;
  char16 local_44;
  undefined1 local_41;
  CharCount maxBackup;
  Char matchC;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  Char *pCStack_28;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToCharAndBackupInst *this_local;
  
  local_41 = firstIteration;
  _maxBackup = inputOffset;
  inputOffset_local = matchStart;
  matchStart_local._4_4_ = inputLength;
  pCStack_28 = input;
  input_local = (Char *)matcher;
  matcher_local = (Matcher *)this;
  if (inputLength - *matchStart < (this->super_BackupMixin).backup.lower) {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  else if (*inputOffset < *nextSyncInputOffset) {
    *instPointer = *instPointer + 0xb;
    this_local._7_1_ = false;
  }
  else {
    if (*inputOffset - *matchStart < (this->super_BackupMixin).backup.lower) {
      *inputOffset = *matchStart + (this->super_BackupMixin).backup.lower;
    }
    local_44 = (this->super_CharMixin).c;
    while( true ) {
      bVar3 = false;
      if (*_maxBackup < matchStart_local._4_4_) {
        bVar3 = pCStack_28[*_maxBackup] != local_44;
      }
      if (!bVar3) break;
      Matcher::CompStats((Matcher *)input_local);
      *_maxBackup = *_maxBackup + 1;
    }
    if (*_maxBackup < matchStart_local._4_4_) {
      *nextSyncInputOffset = *_maxBackup + 1;
      if ((this->super_BackupMixin).backup.upper != 0xffffffff) {
        local_48 = *_maxBackup - *inputOffset_local;
        CVar1 = *_maxBackup;
        local_4c = (this->super_BackupMixin).backup.upper;
        puVar2 = min<unsigned_int>(&local_48,&local_4c);
        *inputOffset_local = CVar1 - *puVar2;
      }
      *_maxBackup = *inputOffset_local;
      *instPointer = *instPointer + 0xb;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ =
           Matcher::HardFail((Matcher *)input_local,pCStack_28,matchStart_local._4_4_,
                             inputOffset_local,_maxBackup,instPointer,contStack,assertionStack,
                             qcTicks,ImmediateFail);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToCharAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const Char matchC = c;
        while (inputOffset < inputLength && input[inputOffset] != matchC)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }